

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O0

uint32_t duckdb::ParquetCrypto::WriteData
                   (TProtocol *oprot,const_data_ptr_t buffer,uint32_t buffer_size,string *key,
                   EncryptionUtil *encryption_util_p)

{
  uint32_t uVar1;
  element_type *this;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> *in_RCX;
  uint in_EDX;
  int in_ESI;
  size_t in_R8;
  EncryptionTransport *etrans;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> eprot;
  TCompactProtocolFactoryT<duckdb::EncryptionTransport> tproto_factory;
  EncryptionTransport *in_stack_00000fa0;
  TProtocol *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  EncryptionUtil *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  TProtocol *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffe8;
  
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::EncryptionTransport>::
  TCompactProtocolFactoryT
            ((TCompactProtocolFactoryT<duckdb::EncryptionTransport> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  ::std::
  make_shared<duckdb::EncryptionTransport,duckdb_apache::thrift::protocol::TProtocol&,std::__cxx11::string_const&,duckdb::EncryptionUtil_const&>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ::std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::
  shared_ptr<duckdb::EncryptionTransport,void>
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (shared_ptr<duckdb::EncryptionTransport> *)in_stack_ffffffffffffff48);
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::EncryptionTransport>::
  getProtocol((TCompactProtocolFactoryT<duckdb::EncryptionTransport> *)
              CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX);
  ::std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x2320c86);
  ::std::shared_ptr<duckdb::EncryptionTransport>::~shared_ptr
            ((shared_ptr<duckdb::EncryptionTransport> *)0x2320c90);
  ::std::
  __shared_ptr_access<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2320c9a);
  duckdb_apache::thrift::protocol::TProtocol::getTransport(in_stack_ffffffffffffff48);
  this = ::std::
         __shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*((__shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  ::std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x2320cc7);
  duckdb_apache::thrift::transport::TTransport::write(this,in_ESI,(void *)(ulong)in_EDX,in_R8);
  uVar1 = EncryptionTransport::Finalize(in_stack_00000fa0);
  ::std::shared_ptr<duckdb_apache::thrift::protocol::TProtocol>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::protocol::TProtocol> *)0x2320d06);
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::EncryptionTransport>::
  ~TCompactProtocolFactoryT((TCompactProtocolFactoryT<duckdb::EncryptionTransport> *)0x2320d13);
  return uVar1;
}

Assistant:

uint32_t ParquetCrypto::WriteData(TProtocol &oprot, const const_data_ptr_t buffer, const uint32_t buffer_size,
                                  const string &key, const EncryptionUtil &encryption_util_p) {
	// FIXME: we know the size upfront so we could do a streaming write instead of this
	// Create encryption protocol
	TCompactProtocolFactoryT<EncryptionTransport> tproto_factory;
	auto eprot = tproto_factory.getProtocol(std::make_shared<EncryptionTransport>(oprot, key, encryption_util_p));
	auto &etrans = reinterpret_cast<EncryptionTransport &>(*eprot->getTransport());

	// Write the data in memory
	etrans.write(buffer, buffer_size);

	// Encrypt and write to oprot
	return etrans.Finalize();
}